

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTree::climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
          (QGraphicsSceneBspTree *this,anon_class_16_2_a6e56972 *visitor,QRectF *rect,int index)

{
  Node *pNVar1;
  Type TVar2;
  int iVar3;
  Node *pNVar4;
  QList<QGraphicsItem_*> *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  ulong uVar7;
  QGraphicsItem *this_00;
  ulong uVar8;
  long in_FS_OFFSET;
  double dVar9;
  QGraphicsItem *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    if ((this->nodes).d.size == 0) {
LAB_0062ffc9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    pNVar4 = (this->nodes).d.ptr;
    pNVar1 = pNVar4 + index;
    iVar3 = index * 2 + 1;
    TVar2 = pNVar4[index].type;
    if (TVar2 == Horizontal) {
      if (rect->yp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->yp) {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (this,visitor,rect,iVar3);
        dVar9 = rect->yp + rect->h;
LAB_0062ff26:
        if (dVar9 < (pNVar1->field_0).offset) goto LAB_0062ffc9;
      }
    }
    else {
      if (TVar2 != Vertical) {
        if (TVar2 == Leaf) {
          iVar3 = (pNVar1->field_0).leafIndex;
          pQVar5 = (this->leaves).d.ptr;
          if (pQVar5[iVar3].d.size != 0) {
            uVar8 = 0;
            do {
              this_00 = pQVar5[iVar3].d.ptr[uVar8];
              if ((visitor->onlyTopLevelItems == true) &&
                 (((this_00->d_ptr).d)->parent != (QGraphicsItem *)0x0)) {
                this_00 = QGraphicsItem::topLevelItem(this_00);
              }
              pQVar6 = (this_00->d_ptr).d;
              uVar7 = *(ulong *)&pQVar6->field_0x160;
              if (((uint)uVar7 & 0x4020) == 0x20) {
                *(ulong *)&pQVar6->field_0x160 = uVar7 | 0x4000;
                local_38 = this_00;
                QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                          ((QPodArrayOps<QGraphicsItem*> *)visitor->foundItems,0,&local_38);
              }
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ulong)pQVar5[iVar3].d.size);
          }
        }
        goto LAB_0062ffc9;
      }
      if (rect->xp <= (pNVar1->field_0).offset && (pNVar1->field_0).offset != rect->xp) {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (this,visitor,rect,iVar3);
        dVar9 = rect->xp + rect->w;
        goto LAB_0062ff26;
      }
    }
    index = index * 2 + 2;
  } while( true );
}

Assistant:

void QGraphicsSceneBspTree::climbTree(Visitor &&visitor, const QRectF &rect, int index) const
{
    if (nodes.isEmpty())
        return;

    const Node &node = nodes.at(index);
    const int childIndex = firstChildIndex(index);

    switch (node.type) {
    case Node::Leaf: {
        visitor(const_cast<QList<QGraphicsItem*>*>(&leaves[node.leafIndex]));
        break;
    }
    case Node::Vertical:
        if (rect.left() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.right() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
        break;
    case Node::Horizontal:
        if (rect.top() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.bottom() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
    }
}